

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct16_stage5_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  undefined4 uVar10;
  char in_DL;
  long in_RSI;
  undefined1 (*in_RDI) [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i cospi_p32_p32;
  __m128i cospi_m32_p32;
  undefined2 local_3c8;
  undefined2 uStack_3c6;
  undefined2 uStack_3c4;
  undefined2 uStack_3c2;
  undefined2 local_3b8;
  undefined2 uStack_3b6;
  undefined2 uStack_3b4;
  undefined2 uStack_3b2;
  undefined2 uStack_3a0;
  undefined2 uStack_39e;
  undefined2 uStack_39c;
  undefined2 uStack_39a;
  undefined2 uStack_390;
  undefined2 uStack_38e;
  undefined2 uStack_38c;
  undefined2 uStack_38a;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  
  uVar9 = -*(int *)(in_RSI + 0x80) & 0xffffU | *(int *)(in_RSI + 0x80) << 0x10;
  uVar10 = CONCAT22(*(undefined2 *)(in_RSI + 0x80),*(undefined2 *)(in_RSI + 0x80));
  auVar12 = *in_RDI;
  auVar11 = paddsw(*in_RDI,in_RDI[3]);
  *in_RDI = auVar11;
  auVar12 = psubsw(auVar12,in_RDI[3]);
  in_RDI[3] = auVar12;
  auVar12 = in_RDI[1];
  auVar11 = paddsw(in_RDI[1],in_RDI[2]);
  in_RDI[1] = auVar11;
  auVar12 = psubsw(auVar12,in_RDI[2]);
  in_RDI[2] = auVar12;
  uVar1 = *(undefined8 *)in_RDI[5];
  uVar2 = *(undefined8 *)in_RDI[6];
  local_3b8 = (undefined2)uVar1;
  uStack_3b6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_3b4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_3b2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_3c8 = (undefined2)uVar2;
  uStack_3c6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_3c4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_3c2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[5] + 8);
  uVar2 = *(undefined8 *)(in_RDI[6] + 8);
  uStack_390 = (undefined2)uVar1;
  uStack_38e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_38c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_38a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_3a0 = (undefined2)uVar2;
  uStack_39e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_39c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_39a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_3c8;
  auVar4._0_2_ = local_3b8;
  auVar4._4_2_ = uStack_3b6;
  auVar4._6_2_ = uStack_3c6;
  auVar4._10_2_ = uStack_3c4;
  auVar4._8_2_ = uStack_3b4;
  auVar4._12_2_ = uStack_3b2;
  auVar4._14_2_ = uStack_3c2;
  auVar13._8_8_ = CONCAT44(uVar9,uVar9);
  auVar13._0_8_ = CONCAT44(uVar9,uVar9);
  auVar13 = pmaddwd(auVar4,auVar13);
  auVar3._2_2_ = uStack_3a0;
  auVar3._0_2_ = uStack_390;
  auVar3._4_2_ = uStack_38e;
  auVar3._6_2_ = uStack_39e;
  auVar3._10_2_ = uStack_39c;
  auVar3._8_2_ = uStack_38c;
  auVar3._12_2_ = uStack_38a;
  auVar3._14_2_ = uStack_39a;
  auVar14._8_8_ = CONCAT44(uVar9,uVar9);
  auVar14._0_8_ = CONCAT44(uVar9,uVar9);
  auVar14 = pmaddwd(auVar3,auVar14);
  auVar16._2_2_ = local_3c8;
  auVar16._0_2_ = local_3b8;
  auVar16._4_2_ = uStack_3b6;
  auVar16._6_2_ = uStack_3c6;
  auVar16._10_2_ = uStack_3c4;
  auVar16._8_2_ = uStack_3b4;
  auVar16._12_2_ = uStack_3b2;
  auVar16._14_2_ = uStack_3c2;
  auVar15._8_8_ = CONCAT44(uVar10,uVar10);
  auVar15._0_8_ = CONCAT44(uVar10,uVar10);
  auVar15 = pmaddwd(auVar16,auVar15);
  auVar11._2_2_ = uStack_3a0;
  auVar11._0_2_ = uStack_390;
  auVar11._4_2_ = uStack_38e;
  auVar11._6_2_ = uStack_39e;
  auVar11._10_2_ = uStack_39c;
  auVar11._8_2_ = uStack_38c;
  auVar11._12_2_ = uStack_38a;
  auVar11._14_2_ = uStack_39a;
  auVar12._8_8_ = CONCAT44(uVar10,uVar10);
  auVar12._0_8_ = CONCAT44(uVar10,uVar10);
  auVar12 = pmaddwd(auVar11,auVar12);
  local_298 = auVar13._0_4_;
  iStack_294 = auVar13._4_4_;
  iStack_290 = auVar13._8_4_;
  iStack_28c = auVar13._12_4_;
  local_2a8 = (int)in_XMM0_Qa;
  iStack_2a4 = (int)((ulong)in_XMM0_Qa >> 0x20);
  iStack_2a0 = (int)in_XMM0_Qb;
  iStack_29c = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_2b8 = auVar14._0_4_;
  iStack_2b4 = auVar14._4_4_;
  iStack_2b0 = auVar14._8_4_;
  iStack_2ac = auVar14._12_4_;
  local_2d8 = auVar15._0_4_;
  iStack_2d4 = auVar15._4_4_;
  iStack_2d0 = auVar15._8_4_;
  iStack_2cc = auVar15._12_4_;
  local_2f8 = auVar12._0_4_;
  iStack_2f4 = auVar12._4_4_;
  iStack_2f0 = auVar12._8_4_;
  iStack_2ec = auVar12._12_4_;
  auVar12 = ZEXT416((uint)(int)in_DL);
  auVar11 = ZEXT416((uint)(int)in_DL);
  auVar15 = ZEXT416((uint)(int)in_DL);
  auVar16 = ZEXT416((uint)(int)in_DL);
  auVar8._4_4_ = iStack_294 + iStack_2a4 >> auVar12;
  auVar8._0_4_ = local_298 + local_2a8 >> auVar12;
  auVar8._12_4_ = iStack_28c + iStack_29c >> auVar12;
  auVar8._8_4_ = iStack_290 + iStack_2a0 >> auVar12;
  auVar7._4_4_ = iStack_2b4 + iStack_2a4 >> auVar11;
  auVar7._0_4_ = local_2b8 + local_2a8 >> auVar11;
  auVar7._12_4_ = iStack_2ac + iStack_29c >> auVar11;
  auVar7._8_4_ = iStack_2b0 + iStack_2a0 >> auVar11;
  auVar12 = packssdw(auVar8,auVar7);
  in_RDI[5] = auVar12;
  auVar6._4_4_ = iStack_2d4 + iStack_2a4 >> auVar15;
  auVar6._0_4_ = local_2d8 + local_2a8 >> auVar15;
  auVar6._12_4_ = iStack_2cc + iStack_29c >> auVar15;
  auVar6._8_4_ = iStack_2d0 + iStack_2a0 >> auVar15;
  auVar5._4_4_ = iStack_2f4 + iStack_2a4 >> auVar16;
  auVar5._0_4_ = local_2f8 + local_2a8 >> auVar16;
  auVar5._12_4_ = iStack_2ec + iStack_29c >> auVar16;
  auVar5._8_4_ = iStack_2f0 + iStack_2a0 >> auVar16;
  auVar12 = packssdw(auVar6,auVar5);
  in_RDI[6] = auVar12;
  auVar12 = in_RDI[8];
  auVar11 = paddsw(in_RDI[8],in_RDI[0xb]);
  in_RDI[8] = auVar11;
  auVar12 = psubsw(auVar12,in_RDI[0xb]);
  in_RDI[0xb] = auVar12;
  auVar12 = in_RDI[9];
  auVar11 = paddsw(in_RDI[9],in_RDI[10]);
  in_RDI[9] = auVar11;
  auVar12 = psubsw(auVar12,in_RDI[10]);
  in_RDI[10] = auVar12;
  auVar12 = in_RDI[0xc];
  auVar11 = psubsw(in_RDI[0xf],in_RDI[0xc]);
  in_RDI[0xc] = auVar11;
  auVar12 = paddsw(in_RDI[0xf],auVar12);
  in_RDI[0xf] = auVar12;
  auVar12 = in_RDI[0xd];
  auVar11 = psubsw(in_RDI[0xe],in_RDI[0xd]);
  in_RDI[0xd] = auVar11;
  auVar12 = paddsw(in_RDI[0xe],auVar12);
  in_RDI[0xe] = auVar12;
  return;
}

Assistant:

static inline void idct16_stage5_sse2(__m128i *x, const int32_t *cospi,
                                      const __m128i __rounding,
                                      int8_t cos_bit) {
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);
}